

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O3

string * google::protobuf::compiler::php::ClassNamePrefix<google::protobuf::EnumDescriptor>
                   (string *__return_storage_ptr__,string *classname,EnumDescriptor *desc)

{
  long *plVar1;
  long lVar2;
  long lVar3;
  
  plVar1 = *(long **)(*(long *)(*(FileDescriptor **)(desc + 0x10) + 0x88) + 0x78);
  lVar2 = plVar1[1];
  if (lVar2 == 0) {
    ReservedNamePrefix(__return_storage_ptr__,classname,*(FileDescriptor **)(desc + 0x10));
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    lVar3 = *plVar1;
    std::__cxx11::string::_M_construct<char*>((string *)__return_storage_ptr__,lVar3,lVar2 + lVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ClassNamePrefix(const string& classname,
                            const DescriptorType* desc) {
  const string& prefix = (desc->file()->options()).php_class_prefix();
  if (!prefix.empty()) {
    return prefix;
  }

  return ReservedNamePrefix(classname, desc->file());
}